

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_InvalidBinaryOperationsThrow_Test::
~SemanticAnalyserTest_InvalidBinaryOperationsThrow_Test
          (SemanticAnalyserTest_InvalidBinaryOperationsThrow_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, InvalidBinaryOperationsThrow)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    let x: function = \(x: f32): f32 = { ret x; };
    let y: f32 = 12;
    let z: f32 = y + x;
  }
  )SRC";
  throwTest(source);
}